

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

VAOCache * __thiscall
Diligent::RenderDeviceGLImpl::GetVAOCache(RenderDeviceGLImpl *this,NativeGLContextType Context)

{
  mapped_type *pmVar1;
  lock_guard<Threading::SpinLock> local_20;
  SpinLockGuard VAOCacheGuard;
  NativeGLContextType Context_local;
  RenderDeviceGLImpl *this_local;
  
  VAOCacheGuard._M_device = (mutex_type *)Context;
  std::lock_guard<Threading::SpinLock>::lock_guard(&local_20,&this->m_VAOCacheLock);
  pmVar1 = std::
           unordered_map<__GLXcontextRec_*,_Diligent::VAOCache,_std::hash<__GLXcontextRec_*>,_std::equal_to<__GLXcontextRec_*>,_std::allocator<std::pair<__GLXcontextRec_*const,_Diligent::VAOCache>_>_>
           ::operator[](&this->m_VAOCache,(key_type *)&VAOCacheGuard);
  std::lock_guard<Threading::SpinLock>::~lock_guard(&local_20);
  return pmVar1;
}

Assistant:

VAOCache& RenderDeviceGLImpl::GetVAOCache(GLContext::NativeGLContextType Context)
{
    Threading::SpinLockGuard VAOCacheGuard{m_VAOCacheLock};
    return m_VAOCache[Context];
}